

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

ssize_t __thiscall
capnp::anon_unknown_0::AsyncMessageReader::read
          (AsyncMessageReader *this,int __fd,void *__buf,size_t __nbytes)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  void *pvVar3;
  _func_int **extraout_RAX;
  _func_int **extraout_RAX_00;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var4;
  PromiseArena *in_R8;
  OwnPromiseNode local_70;
  PromiseArena *local_68;
  AsyncMessageReader *local_60;
  OwnPromiseNode local_58;
  _func_int **local_50;
  SourceLocation local_48;
  
  pp_Var4 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  local_68 = in_R8;
  local_60 = this;
  (**(code **)(*__buf + 8))(&local_70,__buf,(long)pp_Var4 + 0xcc,8,8);
  OVar2.ptr = local_70.ptr;
  pPVar1 = ((local_70.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_70.ptr - (long)pPVar1) < 0x40) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_70,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:87:13)>
               ::anon_class_32_3_1eb37b15_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3c0) = &PTR_destroy_006cb670;
    *(_func_int ***)((long)pvVar3 + 0x3e0) = pp_Var4;
    *(void **)((long)pvVar3 + 1000) = __buf;
    *(size_t *)((long)pvVar3 + 0x3f0) = __nbytes;
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = local_68;
    *(void **)((long)pvVar3 + 0x3c8) = pvVar3;
  }
  else {
    ((local_70.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_70.ptr + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_70,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:87:13)>
               ::anon_class_32_3_1eb37b15_for_func::operator());
    OVar2.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006cb670;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var4;
    OVar2.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)__buf;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)__nbytes;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = local_68;
    OVar2.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_58.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,&local_48);
  OVar2.ptr = local_58.ptr;
  (local_60->super_MessageReader)._vptr_MessageReader = local_50;
  if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    local_50 = extraout_RAX;
  }
  OVar2.ptr = local_70.ptr;
  if (&(local_70.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_70.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    local_50 = extraout_RAX_00;
  }
  return (ssize_t)local_50;
}

Assistant:

kj::Promise<bool> AsyncMessageReader::read(kj::AsyncInputStream& inputStream,
                                           kj::ArrayPtr<word> scratchSpace) {
  return inputStream.tryRead(firstWord, sizeof(firstWord), sizeof(firstWord))
      .then([this,&inputStream,KJ_CPCAP(scratchSpace)](size_t n) mutable -> kj::Promise<bool> {
    if (n == 0) {
      return false;
    } else if (n < sizeof(firstWord)) {
      // EOF in first word.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
      return false;
    }

    return readAfterFirstWord(inputStream, scratchSpace).then([]() { return true; });
  });
}